

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

Role __thiscall QAccessibleDisplay::role(QAccessibleDisplay *this)

{
  char cVar1;
  Role RVar2;
  QLabel *this_00;
  QMovie *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  QPixmap aQStack_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QLabel *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
  if (this_00 == (QLabel *)0x0) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar4 = QMetaObject::cast((QObject *)&QProgressBar::staticMetaObject);
    RVar2 = ProgressBar;
    if (lVar4 != 0) goto LAB_00523e56;
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar3 = (QMovie *)QMetaObject::cast((QObject *)&QStatusBar::staticMetaObject);
    RVar2 = StatusBar;
  }
  else {
    QLabel::pixmap((QLabel *)aQStack_48);
    cVar1 = QPixmap::isNull();
    QPixmap::~QPixmap(aQStack_48);
    RVar2 = Graphic;
    if (cVar1 == '\0') goto LAB_00523e56;
    QLabel::picture((QLabel *)aQStack_48);
    cVar1 = QPicture::isNull();
    QPicture::~QPicture((QPicture *)aQStack_48);
    if (cVar1 == '\0') goto LAB_00523e56;
    pQVar3 = QLabel::movie(this_00);
    RVar2 = Animation;
  }
  if (pQVar3 == (QMovie *)0x0) {
    RVar2 = QAccessibleWidget::role(&this->super_QAccessibleWidget);
  }
LAB_00523e56:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return RVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::Role QAccessibleDisplay::role() const
{
#if QT_CONFIG(label)
    QLabel *l = qobject_cast<QLabel*>(object());
    if (l) {
        if (!l->pixmap().isNull())
            return QAccessible::Graphic;
#ifndef QT_NO_PICTURE
        if (!l->picture().isNull())
            return QAccessible::Graphic;
#endif
#if QT_CONFIG(movie)
        if (l->movie())
            return QAccessible::Animation;
#endif
#if QT_CONFIG(progressbar)
    } else if (qobject_cast<QProgressBar*>(object())) {
        return QAccessible::ProgressBar;
#endif
#if QT_CONFIG(statusbar)
    } else if (qobject_cast<QStatusBar*>(object())) {
        return QAccessible::StatusBar;
#endif
    }
#endif
    return QAccessibleWidget::role();
}